

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_32sto12u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  OPJ_INT32 OVar2;
  undefined1 *puVar3;
  OPJ_UINT32 src0_1;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffffe); _src1 = _src1 + 2) {
    uVar1 = pSrc[_src1];
    OVar2 = pSrc[_src1 + 1];
    *(char *)length_local = (char)(uVar1 >> 4);
    puVar3 = (undefined1 *)(length_local + 2);
    *(byte *)(length_local + 1) = (byte)((uVar1 & 0xf) << 4) | (byte)((uint)OVar2 >> 8);
    length_local = length_local + 3;
    *puVar3 = (char)OVar2;
  }
  if ((length & 1) != 0) {
    uVar1 = pSrc[_src1];
    *(char *)length_local = (char)(uVar1 >> 4);
    *(char *)(length_local + 1) = (char)((uVar1 & 0xf) << 4);
  }
  return;
}

Assistant:

static void tif_32sto12u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i+=2U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		
		*pDst++ = (OPJ_BYTE)(src0 >> 4);
		*pDst++ = (OPJ_BYTE)(((src0 & 0xFU) << 4) | (src1 >> 8));
		*pDst++ = (OPJ_BYTE)(src1);
	}
	
	if (length & 1U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		*pDst++ = (OPJ_BYTE)(src0 >> 4);
		*pDst++ = (OPJ_BYTE)(((src0 & 0xFU) << 4));
	}
}